

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

void leb_SplitNodeConforming_Quad(leb_Heap *leb,leb_Node node)

{
  int32_t iVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  leb_Node node_00;
  leb_SameDepthNeighborIDs lVar5;
  
  if (leb->maxDepth != node.depth) {
    iVar1 = leb->minDepth;
    leb__SplitNode(leb,node);
    lVar5 = leb_DecodeSameDepthNeighborIDs_Quad(node);
    uVar3 = lVar5._8_8_;
    bVar2 = (byte)iVar1;
    if (lVar5.edge >> (bVar2 & 0x1f) != 0) {
      uVar4 = (ulong)node & 0xffffffff00000000;
      if (((undefined1  [16])lVar5 & (undefined1  [16])0xffffffff) == (undefined1  [16])0x0) {
        uVar4 = uVar3 & 0xffffffff;
      }
      node_00 = (leb_Node)(uVar4 | uVar3 & 0xffffffff);
      do {
        leb__SplitNode(leb,node_00);
        if ((int)uVar3 != node_00.depth) {
          node_00 = (leb_Node)
                    (((ulong)node_00 & 0xffffffff00000000) - 0x100000000 |
                    (ulong)node_00 >> 1 & 0x7fffffff);
        }
        leb__SplitNode(leb,node_00);
        lVar5 = leb_DecodeSameDepthNeighborIDs_Quad(node_00);
        uVar3 = lVar5._8_8_;
        uVar4 = (ulong)node_00 & 0xffffffff00000000;
        if (((undefined1  [16])lVar5 & (undefined1  [16])0xffffffff) == (undefined1  [16])0x0) {
          uVar4 = uVar3 & 0xffffffff;
        }
        node_00 = (leb_Node)(uVar4 | uVar3 & 0xffffffff);
      } while (lVar5.edge >> (bVar2 & 0x1f) != 0);
    }
  }
  return;
}

Assistant:

LEBDEF void leb_SplitNodeConforming_Quad(leb_Heap *leb, const leb_Node node)
{
    if (!leb_IsCeilNode(leb, node)) {
        const uint32_t minNodeID = 1u << leb->minDepth;
        leb_Node nodeIterator = node;

        leb__SplitNode(leb, nodeIterator);
        nodeIterator = leb__EdgeNode_Quad(nodeIterator);

        while (nodeIterator.id >= minNodeID) {
            leb__SplitNode(leb, nodeIterator);
            nodeIterator = leb_ParentNode(nodeIterator);
            leb__SplitNode(leb, nodeIterator);
            nodeIterator = leb__EdgeNode_Quad(nodeIterator);
        }
    }
}